

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash_test.cpp
# Opt level: O2

pint p_test_case_sha1_test(void)

{
  p_test_module_fail_counter = 0;
  p_libsys_init();
  general_hash_test(P_CRYPTO_HASH_TYPE_SHA1,0x14,"abc",
                    "abcdbcdecdefdefgefghfghighijhijkijkljklmklmnlmnomnopnopq",&DAT_00103fb0,
                    &DAT_00103fd0,&DAT_00103ff0,"a9993e364706816aba3e25717850c26c9cd0d89d",
                    "84983e441c3bd26ebaae4aa1f95129e5e54670f1",
                    "34aa973cd4c4daa4f61eeb2bdbad27316534016f",
                    "56309c2dbe04a348ec801ca5f40b035bad01f907");
  p_libsys_shutdown();
  return -(uint)(p_test_module_fail_counter != 0);
}

Assistant:

P_TEST_CASE_BEGIN (sha1_test)
{
	const puchar	hash_etalon_1[] = {169, 153,  62,  54,  71,   6, 129, 106,
					   186,  62,  37, 113, 120,  80, 194, 108,
					   156, 208, 216, 157};
	const puchar	hash_etalon_2[] = {132, 152,  62,  68,  28,  59, 210, 110,
					   186, 174,  74, 161, 249,  81,  41, 229,
					   229,  70, 112, 241};
	const puchar	hash_etalon_3[] = { 52, 170, 151,  60, 212, 196, 218, 164,
					   246,  30, 235,  43, 219, 173,  39,  49,
					   101,  52,   1, 111};

	p_libsys_init ();

	general_hash_test (P_CRYPTO_HASH_TYPE_SHA1,
			   20,
			   "abc",
			   "abcdbcdecdefdefgefghfghighijhijkijkljklmklmnlmnomnopnopq",
			   hash_etalon_1,
			   hash_etalon_2,
			   hash_etalon_3,
			   "a9993e364706816aba3e25717850c26c9cd0d89d",
			   "84983e441c3bd26ebaae4aa1f95129e5e54670f1",
			   "34aa973cd4c4daa4f61eeb2bdbad27316534016f",
			   "56309c2dbe04a348ec801ca5f40b035bad01f907");

	p_libsys_shutdown ();
}